

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromFace(ON_SubDFace *f,uchar ftag)

{
  uchar ftag_local;
  ON_SubDFace *f_local;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  if (f == (ON_SubDFace *)0x0) {
    _f_local = (ON_SubD_ComponentIdTypeAndTag)ZEXT816((ulong)(float  [2])0x0);
  }
  else {
    _f_local = CreateFromFaceId((f->super_ON_SubDComponentBase).m_id,ftag);
  }
  return _f_local;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromFace(const ON_SubDFace* f, unsigned char ftag)
{
  ON_SubD_ComponentIdTypeAndTag itt
    = (nullptr != f)
    ? ON_SubD_ComponentIdTypeAndTag::CreateFromFaceId(f->m_id, ftag)
    : ON_SubD_ComponentIdTypeAndTag::Unset;
  //if (itt.m_id > 0)
  //  itt.m_cptr = ON_SubDComponentPtr::Create(f);
  return itt;
}